

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack4.h
# Opt level: O0

void ncnn::convdw5x5s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _k44_1;
  __m128 _k43_1;
  __m128 _k42_1;
  __m128 _k41_1;
  __m128 _k40_1;
  __m128 _r44_1;
  __m128 _r43_1;
  __m128 _r42_1;
  __m128 _r41_1;
  __m128 _r40_1;
  __m128 _k34_1;
  __m128 _k33_1;
  __m128 _k32_1;
  __m128 _k31_1;
  __m128 _k30_1;
  __m128 _r34_1;
  __m128 _r33_1;
  __m128 _r32_1;
  __m128 _r31_1;
  __m128 _r30_1;
  __m128 _k24_1;
  __m128 _k23_1;
  __m128 _k22_1;
  __m128 _k21_1;
  __m128 _k20_1;
  __m128 _r24_1;
  __m128 _r23_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _k14_1;
  __m128 _k13_1;
  __m128 _k12_1;
  __m128 _k11_1;
  __m128 _k10_1;
  __m128 _r14_1;
  __m128 _r13_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _k04_1;
  __m128 _k03_1;
  __m128 _k02_1;
  __m128 _k01_1;
  __m128 _k00_1;
  __m128 _r04_1;
  __m128 _r03_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  int j_1;
  __m128 _r54;
  __m128 _r53;
  __m128 _r52;
  __m128 _r51;
  __m128 _r50;
  __m128 _k44;
  __m128 _k43;
  __m128 _k42;
  __m128 _k41;
  __m128 _k40;
  __m128 _r44;
  __m128 _r43;
  __m128 _r42;
  __m128 _r41;
  __m128 _r40;
  __m128 _k34;
  __m128 _k33;
  __m128 _k32;
  __m128 _k31;
  __m128 _k30;
  __m128 _r34;
  __m128 _r33;
  __m128 _r32;
  __m128 _r31;
  __m128 _r30;
  __m128 _k24;
  __m128 _k23;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _r24;
  __m128 _r23;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _k14;
  __m128 _k13;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _r14;
  __m128 _r13;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _k04;
  __m128 _k03;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  __m128 _r04;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum1;
  __m128 _sum0;
  int j;
  int i;
  float *r5;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr1;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  int local_26cc;
  int local_2330;
  int local_232c;
  undefined8 *local_2328;
  undefined8 *local_2320;
  undefined8 *local_2318;
  undefined8 *local_2310;
  undefined8 *local_2308;
  undefined8 *local_2300;
  undefined8 *local_22b0;
  undefined8 *local_22a8;
  int local_222c;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float local_1c28;
  float fStack_1c24;
  float fStack_1c20;
  float fStack_1c1c;
  float local_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float local_1bc8;
  float fStack_1bc4;
  float fStack_1bc0;
  float fStack_1bbc;
  float local_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float local_1b68;
  float fStack_1b64;
  float fStack_1b60;
  float fStack_1b5c;
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float local_1b08;
  float fStack_1b04;
  float fStack_1b00;
  float fStack_1afc;
  float local_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float local_1aa8;
  float fStack_1aa4;
  float fStack_1aa0;
  float fStack_1a9c;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float fStack_1a3c;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float local_1988;
  float fStack_1984;
  float fStack_1980;
  float fStack_197c;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float local_18c8;
  float fStack_18c4;
  float fStack_18c0;
  float fStack_18bc;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float local_1808;
  float fStack_1804;
  float fStack_1800;
  float fStack_17fc;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float fStack_179c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  float local_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float local_1688;
  float fStack_1684;
  float fStack_1680;
  float fStack_167c;
  float local_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  float local_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float local_1568;
  float fStack_1564;
  float fStack_1560;
  float fStack_155c;
  float local_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float local_1508;
  float fStack_1504;
  float fStack_1500;
  float fStack_14fc;
  float local_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float local_14a8;
  float fStack_14a4;
  float fStack_14a0;
  float fStack_149c;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float local_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float local_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float local_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar6 = in_RSI[6];
  lVar7 = in_RDI[7];
  lVar4 = *in_RCX;
  for (local_222c = 0; local_222c < (int)lVar7; local_222c = local_222c + 1) {
    local_22a8 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_222c * in_RSI[2]);
    if (lVar4 == 0) {
      local_2a48 = 0;
      uStack_2a40 = 0;
    }
    else {
      puVar8 = (undefined8 *)(lVar4 + (long)(local_222c << 2) * 4);
      local_2a48 = *puVar8;
      uStack_2a40 = puVar8[1];
    }
    puVar8 = (undefined8 *)
             (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_222c * in_RDX[2]);
    local_22b0 = (undefined8 *)((long)local_22a8 + (long)*(int *)((long)in_RSI + 0x2c) * in_RSI[2]);
    iVar3 = *(int *)((long)in_RDI + 0x2c);
    local_2300 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_222c * in_RDI[2]);
    lVar5 = in_RDI[2];
    local_2308 = (undefined8 *)((long)local_2300 + iVar3 * lVar5);
    local_2310 = (undefined8 *)((long)local_2300 + (long)iVar3 * 2 * lVar5);
    local_2318 = (undefined8 *)((long)local_2300 + (long)iVar3 * 3 * lVar5);
    local_2320 = (undefined8 *)((long)local_2300 + (long)iVar3 * 4 * lVar5);
    local_2328 = (undefined8 *)((long)local_2300 + (long)iVar3 * 5 * lVar5);
    local_232c = 0;
    while( true ) {
      local_98 = (float)local_2a48;
      fStack_94 = (float)((ulong)local_2a48 >> 0x20);
      fStack_90 = (float)uStack_2a40;
      fStack_8c = (float)((ulong)uStack_2a40 >> 0x20);
      if ((int)lVar6 <= local_232c + 1) break;
      for (local_2330 = 0; local_2330 < iVar2; local_2330 = local_2330 + 1) {
        local_68 = (float)*puVar8;
        fStack_64 = (float)((ulong)*puVar8 >> 0x20);
        fStack_60 = (float)puVar8[1];
        fStack_5c = (float)((ulong)puVar8[1] >> 0x20);
        local_78 = (float)*local_2300;
        fStack_74 = (float)((ulong)*local_2300 >> 0x20);
        fStack_70 = (float)local_2300[1];
        fStack_6c = (float)((ulong)local_2300[1] >> 0x20);
        local_c8 = (float)puVar8[2];
        fStack_c4 = (float)((ulong)puVar8[2] >> 0x20);
        fStack_c0 = (float)puVar8[3];
        fStack_bc = (float)((ulong)puVar8[3] >> 0x20);
        local_d8 = (float)local_2300[2];
        fStack_d4 = (float)((ulong)local_2300[2] >> 0x20);
        fStack_d0 = (float)local_2300[3];
        fStack_cc = (float)((ulong)local_2300[3] >> 0x20);
        local_128 = (float)puVar8[4];
        fStack_124 = (float)((ulong)puVar8[4] >> 0x20);
        fStack_120 = (float)puVar8[5];
        fStack_11c = (float)((ulong)puVar8[5] >> 0x20);
        local_138 = (float)local_2300[4];
        fStack_134 = (float)((ulong)local_2300[4] >> 0x20);
        fStack_130 = (float)local_2300[5];
        fStack_12c = (float)((ulong)local_2300[5] >> 0x20);
        local_188 = (float)puVar8[6];
        fStack_184 = (float)((ulong)puVar8[6] >> 0x20);
        fStack_180 = (float)puVar8[7];
        fStack_17c = (float)((ulong)puVar8[7] >> 0x20);
        local_198 = (float)local_2300[6];
        fStack_194 = (float)((ulong)local_2300[6] >> 0x20);
        fStack_190 = (float)local_2300[7];
        fStack_18c = (float)((ulong)local_2300[7] >> 0x20);
        local_1e8 = (float)puVar8[8];
        fStack_1e4 = (float)((ulong)puVar8[8] >> 0x20);
        fStack_1e0 = (float)puVar8[9];
        fStack_1dc = (float)((ulong)puVar8[9] >> 0x20);
        local_1f8 = (float)local_2300[8];
        fStack_1f4 = (float)((ulong)local_2300[8] >> 0x20);
        fStack_1f0 = (float)local_2300[9];
        fStack_1ec = (float)((ulong)local_2300[9] >> 0x20);
        local_258 = (float)*local_2308;
        fStack_254 = (float)((ulong)*local_2308 >> 0x20);
        fStack_250 = (float)local_2308[1];
        fStack_24c = (float)((ulong)local_2308[1] >> 0x20);
        local_2b8 = (float)local_2308[2];
        fStack_2b4 = (float)((ulong)local_2308[2] >> 0x20);
        fStack_2b0 = (float)local_2308[3];
        fStack_2ac = (float)((ulong)local_2308[3] >> 0x20);
        local_318 = (float)local_2308[4];
        fStack_314 = (float)((ulong)local_2308[4] >> 0x20);
        fStack_310 = (float)local_2308[5];
        fStack_30c = (float)((ulong)local_2308[5] >> 0x20);
        local_378 = (float)local_2308[6];
        fStack_374 = (float)((ulong)local_2308[6] >> 0x20);
        fStack_370 = (float)local_2308[7];
        fStack_36c = (float)((ulong)local_2308[7] >> 0x20);
        local_3d8 = (float)local_2308[8];
        fStack_3d4 = (float)((ulong)local_2308[8] >> 0x20);
        fStack_3d0 = (float)local_2308[9];
        fStack_3cc = (float)((ulong)local_2308[9] >> 0x20);
        local_428 = (float)puVar8[10];
        fStack_424 = (float)((ulong)puVar8[10] >> 0x20);
        fStack_420 = (float)puVar8[0xb];
        fStack_41c = (float)((ulong)puVar8[0xb] >> 0x20);
        local_488 = (float)puVar8[0xc];
        fStack_484 = (float)((ulong)puVar8[0xc] >> 0x20);
        fStack_480 = (float)puVar8[0xd];
        fStack_47c = (float)((ulong)puVar8[0xd] >> 0x20);
        local_4e8 = (float)puVar8[0xe];
        fStack_4e4 = (float)((ulong)puVar8[0xe] >> 0x20);
        fStack_4e0 = (float)puVar8[0xf];
        fStack_4dc = (float)((ulong)puVar8[0xf] >> 0x20);
        local_548 = (float)puVar8[0x10];
        fStack_544 = (float)((ulong)puVar8[0x10] >> 0x20);
        fStack_540 = (float)puVar8[0x11];
        fStack_53c = (float)((ulong)puVar8[0x11] >> 0x20);
        local_5a8 = (float)puVar8[0x12];
        fStack_5a4 = (float)((ulong)puVar8[0x12] >> 0x20);
        fStack_5a0 = (float)puVar8[0x13];
        fStack_59c = (float)((ulong)puVar8[0x13] >> 0x20);
        local_618 = (float)*local_2310;
        fStack_614 = (float)((ulong)*local_2310 >> 0x20);
        fStack_610 = (float)local_2310[1];
        fStack_60c = (float)((ulong)local_2310[1] >> 0x20);
        local_678 = (float)local_2310[2];
        fStack_674 = (float)((ulong)local_2310[2] >> 0x20);
        fStack_670 = (float)local_2310[3];
        fStack_66c = (float)((ulong)local_2310[3] >> 0x20);
        local_6d8 = (float)local_2310[4];
        fStack_6d4 = (float)((ulong)local_2310[4] >> 0x20);
        fStack_6d0 = (float)local_2310[5];
        fStack_6cc = (float)((ulong)local_2310[5] >> 0x20);
        local_738 = (float)local_2310[6];
        fStack_734 = (float)((ulong)local_2310[6] >> 0x20);
        fStack_730 = (float)local_2310[7];
        fStack_72c = (float)((ulong)local_2310[7] >> 0x20);
        local_798 = (float)local_2310[8];
        fStack_794 = (float)((ulong)local_2310[8] >> 0x20);
        fStack_790 = (float)local_2310[9];
        fStack_78c = (float)((ulong)local_2310[9] >> 0x20);
        local_7e8 = (float)puVar8[0x14];
        fStack_7e4 = (float)((ulong)puVar8[0x14] >> 0x20);
        fStack_7e0 = (float)puVar8[0x15];
        fStack_7dc = (float)((ulong)puVar8[0x15] >> 0x20);
        local_848 = (float)puVar8[0x16];
        fStack_844 = (float)((ulong)puVar8[0x16] >> 0x20);
        fStack_840 = (float)puVar8[0x17];
        fStack_83c = (float)((ulong)puVar8[0x17] >> 0x20);
        local_8a8 = (float)puVar8[0x18];
        fStack_8a4 = (float)((ulong)puVar8[0x18] >> 0x20);
        fStack_8a0 = (float)puVar8[0x19];
        fStack_89c = (float)((ulong)puVar8[0x19] >> 0x20);
        local_908 = (float)puVar8[0x1a];
        fStack_904 = (float)((ulong)puVar8[0x1a] >> 0x20);
        fStack_900 = (float)puVar8[0x1b];
        fStack_8fc = (float)((ulong)puVar8[0x1b] >> 0x20);
        local_968 = (float)puVar8[0x1c];
        fStack_964 = (float)((ulong)puVar8[0x1c] >> 0x20);
        fStack_960 = (float)puVar8[0x1d];
        fStack_95c = (float)((ulong)puVar8[0x1d] >> 0x20);
        local_9d8 = (float)*local_2318;
        fStack_9d4 = (float)((ulong)*local_2318 >> 0x20);
        fStack_9d0 = (float)local_2318[1];
        fStack_9cc = (float)((ulong)local_2318[1] >> 0x20);
        local_a38 = (float)local_2318[2];
        fStack_a34 = (float)((ulong)local_2318[2] >> 0x20);
        fStack_a30 = (float)local_2318[3];
        fStack_a2c = (float)((ulong)local_2318[3] >> 0x20);
        local_a98 = (float)local_2318[4];
        fStack_a94 = (float)((ulong)local_2318[4] >> 0x20);
        fStack_a90 = (float)local_2318[5];
        fStack_a8c = (float)((ulong)local_2318[5] >> 0x20);
        local_af8 = (float)local_2318[6];
        fStack_af4 = (float)((ulong)local_2318[6] >> 0x20);
        fStack_af0 = (float)local_2318[7];
        fStack_aec = (float)((ulong)local_2318[7] >> 0x20);
        local_b58 = (float)local_2318[8];
        fStack_b54 = (float)((ulong)local_2318[8] >> 0x20);
        fStack_b50 = (float)local_2318[9];
        fStack_b4c = (float)((ulong)local_2318[9] >> 0x20);
        local_ba8 = (float)puVar8[0x1e];
        fStack_ba4 = (float)((ulong)puVar8[0x1e] >> 0x20);
        fStack_ba0 = (float)puVar8[0x1f];
        fStack_b9c = (float)((ulong)puVar8[0x1f] >> 0x20);
        local_c08 = (float)puVar8[0x20];
        fStack_c04 = (float)((ulong)puVar8[0x20] >> 0x20);
        fStack_c00 = (float)puVar8[0x21];
        fStack_bfc = (float)((ulong)puVar8[0x21] >> 0x20);
        local_c68 = (float)puVar8[0x22];
        fStack_c64 = (float)((ulong)puVar8[0x22] >> 0x20);
        fStack_c60 = (float)puVar8[0x23];
        fStack_c5c = (float)((ulong)puVar8[0x23] >> 0x20);
        local_cc8 = (float)puVar8[0x24];
        fStack_cc4 = (float)((ulong)puVar8[0x24] >> 0x20);
        fStack_cc0 = (float)puVar8[0x25];
        fStack_cbc = (float)((ulong)puVar8[0x25] >> 0x20);
        local_d28 = (float)puVar8[0x26];
        fStack_d24 = (float)((ulong)puVar8[0x26] >> 0x20);
        fStack_d20 = (float)puVar8[0x27];
        fStack_d1c = (float)((ulong)puVar8[0x27] >> 0x20);
        local_d98 = (float)*local_2320;
        fStack_d94 = (float)((ulong)*local_2320 >> 0x20);
        fStack_d90 = (float)local_2320[1];
        fStack_d8c = (float)((ulong)local_2320[1] >> 0x20);
        local_df8 = (float)local_2320[2];
        fStack_df4 = (float)((ulong)local_2320[2] >> 0x20);
        fStack_df0 = (float)local_2320[3];
        fStack_dec = (float)((ulong)local_2320[3] >> 0x20);
        local_e58 = (float)local_2320[4];
        fStack_e54 = (float)((ulong)local_2320[4] >> 0x20);
        fStack_e50 = (float)local_2320[5];
        fStack_e4c = (float)((ulong)local_2320[5] >> 0x20);
        local_eb8 = (float)local_2320[6];
        fStack_eb4 = (float)((ulong)local_2320[6] >> 0x20);
        fStack_eb0 = (float)local_2320[7];
        fStack_eac = (float)((ulong)local_2320[7] >> 0x20);
        local_f18 = (float)local_2320[8];
        fStack_f14 = (float)((ulong)local_2320[8] >> 0x20);
        fStack_f10 = (float)local_2320[9];
        fStack_f0c = (float)((ulong)local_2320[9] >> 0x20);
        local_f68 = (float)puVar8[0x28];
        fStack_f64 = (float)((ulong)puVar8[0x28] >> 0x20);
        fStack_f60 = (float)puVar8[0x29];
        fStack_f5c = (float)((ulong)puVar8[0x29] >> 0x20);
        local_fc8 = (float)puVar8[0x2a];
        fStack_fc4 = (float)((ulong)puVar8[0x2a] >> 0x20);
        fStack_fc0 = (float)puVar8[0x2b];
        fStack_fbc = (float)((ulong)puVar8[0x2b] >> 0x20);
        local_1028 = (float)puVar8[0x2c];
        fStack_1024 = (float)((ulong)puVar8[0x2c] >> 0x20);
        fStack_1020 = (float)puVar8[0x2d];
        fStack_101c = (float)((ulong)puVar8[0x2d] >> 0x20);
        local_1088 = (float)puVar8[0x2e];
        fStack_1084 = (float)((ulong)puVar8[0x2e] >> 0x20);
        fStack_1080 = (float)puVar8[0x2f];
        fStack_107c = (float)((ulong)puVar8[0x2f] >> 0x20);
        local_10e8 = (float)puVar8[0x30];
        fStack_10e4 = (float)((ulong)puVar8[0x30] >> 0x20);
        fStack_10e0 = (float)puVar8[0x31];
        fStack_10dc = (float)((ulong)puVar8[0x31] >> 0x20);
        local_1158 = (float)*local_2328;
        fStack_1154 = (float)((ulong)*local_2328 >> 0x20);
        fStack_1150 = (float)local_2328[1];
        fStack_114c = (float)((ulong)local_2328[1] >> 0x20);
        local_11b8 = (float)local_2328[2];
        fStack_11b4 = (float)((ulong)local_2328[2] >> 0x20);
        fStack_11b0 = (float)local_2328[3];
        fStack_11ac = (float)((ulong)local_2328[3] >> 0x20);
        local_1218 = (float)local_2328[4];
        fStack_1214 = (float)((ulong)local_2328[4] >> 0x20);
        fStack_1210 = (float)local_2328[5];
        fStack_120c = (float)((ulong)local_2328[5] >> 0x20);
        local_1278 = (float)local_2328[6];
        fStack_1274 = (float)((ulong)local_2328[6] >> 0x20);
        fStack_1270 = (float)local_2328[7];
        fStack_126c = (float)((ulong)local_2328[7] >> 0x20);
        local_12d8 = (float)local_2328[8];
        fStack_12d4 = (float)((ulong)local_2328[8] >> 0x20);
        fStack_12d0 = (float)local_2328[9];
        fStack_12cc = (float)((ulong)local_2328[9] >> 0x20);
        *local_22a8 = CONCAT44(fStack_10e4 * fStack_f14 +
                               fStack_1084 * fStack_eb4 +
                               fStack_1024 * fStack_e54 +
                               fStack_fc4 * fStack_df4 +
                               fStack_f64 * fStack_d94 +
                               fStack_d24 * fStack_b54 +
                               fStack_cc4 * fStack_af4 +
                               fStack_c64 * fStack_a94 +
                               fStack_c04 * fStack_a34 +
                               fStack_ba4 * fStack_9d4 +
                               fStack_964 * fStack_794 +
                               fStack_904 * fStack_734 +
                               fStack_8a4 * fStack_6d4 +
                               fStack_844 * fStack_674 +
                               fStack_7e4 * fStack_614 +
                               fStack_5a4 * fStack_3d4 +
                               fStack_544 * fStack_374 +
                               fStack_4e4 * fStack_314 +
                               fStack_484 * fStack_2b4 +
                               fStack_424 * fStack_254 +
                               fStack_1e4 * fStack_1f4 +
                               fStack_184 * fStack_194 +
                               fStack_124 * fStack_134 +
                               fStack_c4 * fStack_d4 + fStack_64 * fStack_74 + fStack_94,
                               local_10e8 * local_f18 +
                               local_1088 * local_eb8 +
                               local_1028 * local_e58 +
                               local_fc8 * local_df8 +
                               local_f68 * local_d98 +
                               local_d28 * local_b58 +
                               local_cc8 * local_af8 +
                               local_c68 * local_a98 +
                               local_c08 * local_a38 +
                               local_ba8 * local_9d8 +
                               local_968 * local_798 +
                               local_908 * local_738 +
                               local_8a8 * local_6d8 +
                               local_848 * local_678 +
                               local_7e8 * local_618 +
                               local_5a8 * local_3d8 +
                               local_548 * local_378 +
                               local_4e8 * local_318 +
                               local_488 * local_2b8 +
                               local_428 * local_258 +
                               local_1e8 * local_1f8 +
                               local_188 * local_198 +
                               local_128 * local_138 +
                               local_c8 * local_d8 + local_68 * local_78 + local_98);
        local_22a8[1] =
             CONCAT44(fStack_10dc * fStack_f0c +
                      fStack_107c * fStack_eac +
                      fStack_101c * fStack_e4c +
                      fStack_fbc * fStack_dec +
                      fStack_f5c * fStack_d8c +
                      fStack_d1c * fStack_b4c +
                      fStack_cbc * fStack_aec +
                      fStack_c5c * fStack_a8c +
                      fStack_bfc * fStack_a2c +
                      fStack_b9c * fStack_9cc +
                      fStack_95c * fStack_78c +
                      fStack_8fc * fStack_72c +
                      fStack_89c * fStack_6cc +
                      fStack_83c * fStack_66c +
                      fStack_7dc * fStack_60c +
                      fStack_59c * fStack_3cc +
                      fStack_53c * fStack_36c +
                      fStack_4dc * fStack_30c +
                      fStack_47c * fStack_2ac +
                      fStack_41c * fStack_24c +
                      fStack_1dc * fStack_1ec +
                      fStack_17c * fStack_18c +
                      fStack_11c * fStack_12c +
                      fStack_bc * fStack_cc + fStack_5c * fStack_6c + fStack_8c,
                      fStack_10e0 * fStack_f10 +
                      fStack_1080 * fStack_eb0 +
                      fStack_1020 * fStack_e50 +
                      fStack_fc0 * fStack_df0 +
                      fStack_f60 * fStack_d90 +
                      fStack_d20 * fStack_b50 +
                      fStack_cc0 * fStack_af0 +
                      fStack_c60 * fStack_a90 +
                      fStack_c00 * fStack_a30 +
                      fStack_ba0 * fStack_9d0 +
                      fStack_960 * fStack_790 +
                      fStack_900 * fStack_730 +
                      fStack_8a0 * fStack_6d0 +
                      fStack_840 * fStack_670 +
                      fStack_7e0 * fStack_610 +
                      fStack_5a0 * fStack_3d0 +
                      fStack_540 * fStack_370 +
                      fStack_4e0 * fStack_310 +
                      fStack_480 * fStack_2b0 +
                      fStack_420 * fStack_250 +
                      fStack_1e0 * fStack_1f0 +
                      fStack_180 * fStack_190 +
                      fStack_120 * fStack_130 +
                      fStack_c0 * fStack_d0 + fStack_60 * fStack_70 + fStack_90);
        *local_22b0 = CONCAT44(fStack_10e4 * fStack_12d4 +
                               fStack_1084 * fStack_1274 +
                               fStack_1024 * fStack_1214 +
                               fStack_fc4 * fStack_11b4 +
                               fStack_f64 * fStack_1154 +
                               fStack_d24 * fStack_f14 +
                               fStack_cc4 * fStack_eb4 +
                               fStack_c64 * fStack_e54 +
                               fStack_c04 * fStack_df4 +
                               fStack_ba4 * fStack_d94 +
                               fStack_964 * fStack_b54 +
                               fStack_904 * fStack_af4 +
                               fStack_8a4 * fStack_a94 +
                               fStack_844 * fStack_a34 +
                               fStack_7e4 * fStack_9d4 +
                               fStack_5a4 * fStack_794 +
                               fStack_544 * fStack_734 +
                               fStack_4e4 * fStack_6d4 +
                               fStack_484 * fStack_674 +
                               fStack_424 * fStack_614 +
                               fStack_1e4 * fStack_3d4 +
                               fStack_184 * fStack_374 +
                               fStack_124 * fStack_314 +
                               fStack_c4 * fStack_2b4 + fStack_64 * fStack_254 + fStack_94,
                               local_10e8 * local_12d8 +
                               local_1088 * local_1278 +
                               local_1028 * local_1218 +
                               local_fc8 * local_11b8 +
                               local_f68 * local_1158 +
                               local_d28 * local_f18 +
                               local_cc8 * local_eb8 +
                               local_c68 * local_e58 +
                               local_c08 * local_df8 +
                               local_ba8 * local_d98 +
                               local_968 * local_b58 +
                               local_908 * local_af8 +
                               local_8a8 * local_a98 +
                               local_848 * local_a38 +
                               local_7e8 * local_9d8 +
                               local_5a8 * local_798 +
                               local_548 * local_738 +
                               local_4e8 * local_6d8 +
                               local_488 * local_678 +
                               local_428 * local_618 +
                               local_1e8 * local_3d8 +
                               local_188 * local_378 +
                               local_128 * local_318 +
                               local_c8 * local_2b8 + local_68 * local_258 + local_98);
        local_22b0[1] =
             CONCAT44(fStack_10dc * fStack_12cc +
                      fStack_107c * fStack_126c +
                      fStack_101c * fStack_120c +
                      fStack_fbc * fStack_11ac +
                      fStack_f5c * fStack_114c +
                      fStack_d1c * fStack_f0c +
                      fStack_cbc * fStack_eac +
                      fStack_c5c * fStack_e4c +
                      fStack_bfc * fStack_dec +
                      fStack_b9c * fStack_d8c +
                      fStack_95c * fStack_b4c +
                      fStack_8fc * fStack_aec +
                      fStack_89c * fStack_a8c +
                      fStack_83c * fStack_a2c +
                      fStack_7dc * fStack_9cc +
                      fStack_59c * fStack_78c +
                      fStack_53c * fStack_72c +
                      fStack_4dc * fStack_6cc +
                      fStack_47c * fStack_66c +
                      fStack_41c * fStack_60c +
                      fStack_1dc * fStack_3cc +
                      fStack_17c * fStack_36c +
                      fStack_11c * fStack_30c +
                      fStack_bc * fStack_2ac + fStack_5c * fStack_24c + fStack_8c,
                      fStack_10e0 * fStack_12d0 +
                      fStack_1080 * fStack_1270 +
                      fStack_1020 * fStack_1210 +
                      fStack_fc0 * fStack_11b0 +
                      fStack_f60 * fStack_1150 +
                      fStack_d20 * fStack_f10 +
                      fStack_cc0 * fStack_eb0 +
                      fStack_c60 * fStack_e50 +
                      fStack_c00 * fStack_df0 +
                      fStack_ba0 * fStack_d90 +
                      fStack_960 * fStack_b50 +
                      fStack_900 * fStack_af0 +
                      fStack_8a0 * fStack_a90 +
                      fStack_840 * fStack_a30 +
                      fStack_7e0 * fStack_9d0 +
                      fStack_5a0 * fStack_790 +
                      fStack_540 * fStack_730 +
                      fStack_4e0 * fStack_6d0 +
                      fStack_480 * fStack_670 +
                      fStack_420 * fStack_610 +
                      fStack_1e0 * fStack_3d0 +
                      fStack_180 * fStack_370 +
                      fStack_120 * fStack_310 +
                      fStack_c0 * fStack_2b0 + fStack_60 * fStack_250 + fStack_90);
        local_22a8 = local_22a8 + 2;
        local_22b0 = local_22b0 + 2;
        local_2300 = local_2300 + 2;
        local_2308 = local_2308 + 2;
        local_2310 = local_2310 + 2;
        local_2318 = local_2318 + 2;
        local_2320 = local_2320 + 2;
        local_2328 = local_2328 + 2;
      }
      local_2300 = (undefined8 *)((long)local_2300 + (long)(iVar1 * 4 + 0x10) * 4);
      local_2308 = (undefined8 *)((long)local_2308 + (long)(iVar1 * 4 + 0x10) * 4);
      local_2310 = (undefined8 *)((long)local_2310 + (long)(iVar1 * 4 + 0x10) * 4);
      local_2318 = (undefined8 *)((long)local_2318 + (long)(iVar1 * 4 + 0x10) * 4);
      local_2320 = (undefined8 *)((long)local_2320 + (long)(iVar1 * 4 + 0x10) * 4);
      local_2328 = (undefined8 *)((long)local_2328 + (long)(iVar1 * 4 + 0x10) * 4);
      local_22a8 = (undefined8 *)((long)local_22a8 + (long)(iVar2 << 2) * 4);
      local_22b0 = (undefined8 *)((long)local_22b0 + (long)(iVar2 << 2) * 4);
      local_232c = local_232c + 2;
    }
    for (; local_232c < (int)lVar6; local_232c = local_232c + 1) {
      for (local_26cc = 0; local_26cc < iVar2; local_26cc = local_26cc + 1) {
        local_1328 = (float)*puVar8;
        fStack_1324 = (float)((ulong)*puVar8 >> 0x20);
        fStack_1320 = (float)puVar8[1];
        fStack_131c = (float)((ulong)puVar8[1] >> 0x20);
        local_1338 = (float)*local_2300;
        fStack_1334 = (float)((ulong)*local_2300 >> 0x20);
        fStack_1330 = (float)local_2300[1];
        fStack_132c = (float)((ulong)local_2300[1] >> 0x20);
        local_1388 = (float)puVar8[2];
        fStack_1384 = (float)((ulong)puVar8[2] >> 0x20);
        fStack_1380 = (float)puVar8[3];
        fStack_137c = (float)((ulong)puVar8[3] >> 0x20);
        local_1398 = (float)local_2300[2];
        fStack_1394 = (float)((ulong)local_2300[2] >> 0x20);
        fStack_1390 = (float)local_2300[3];
        fStack_138c = (float)((ulong)local_2300[3] >> 0x20);
        local_13e8 = (float)puVar8[4];
        fStack_13e4 = (float)((ulong)puVar8[4] >> 0x20);
        fStack_13e0 = (float)puVar8[5];
        fStack_13dc = (float)((ulong)puVar8[5] >> 0x20);
        local_13f8 = (float)local_2300[4];
        fStack_13f4 = (float)((ulong)local_2300[4] >> 0x20);
        fStack_13f0 = (float)local_2300[5];
        fStack_13ec = (float)((ulong)local_2300[5] >> 0x20);
        local_1448 = (float)puVar8[6];
        fStack_1444 = (float)((ulong)puVar8[6] >> 0x20);
        fStack_1440 = (float)puVar8[7];
        fStack_143c = (float)((ulong)puVar8[7] >> 0x20);
        local_1458 = (float)local_2300[6];
        fStack_1454 = (float)((ulong)local_2300[6] >> 0x20);
        fStack_1450 = (float)local_2300[7];
        fStack_144c = (float)((ulong)local_2300[7] >> 0x20);
        local_14a8 = (float)puVar8[8];
        fStack_14a4 = (float)((ulong)puVar8[8] >> 0x20);
        fStack_14a0 = (float)puVar8[9];
        fStack_149c = (float)((ulong)puVar8[9] >> 0x20);
        local_14b8 = (float)local_2300[8];
        fStack_14b4 = (float)((ulong)local_2300[8] >> 0x20);
        fStack_14b0 = (float)local_2300[9];
        fStack_14ac = (float)((ulong)local_2300[9] >> 0x20);
        local_1508 = (float)puVar8[10];
        fStack_1504 = (float)((ulong)puVar8[10] >> 0x20);
        fStack_1500 = (float)puVar8[0xb];
        fStack_14fc = (float)((ulong)puVar8[0xb] >> 0x20);
        local_1518 = (float)*local_2308;
        fStack_1514 = (float)((ulong)*local_2308 >> 0x20);
        fStack_1510 = (float)local_2308[1];
        fStack_150c = (float)((ulong)local_2308[1] >> 0x20);
        local_1568 = (float)puVar8[0xc];
        fStack_1564 = (float)((ulong)puVar8[0xc] >> 0x20);
        fStack_1560 = (float)puVar8[0xd];
        fStack_155c = (float)((ulong)puVar8[0xd] >> 0x20);
        local_1578 = (float)local_2308[2];
        fStack_1574 = (float)((ulong)local_2308[2] >> 0x20);
        fStack_1570 = (float)local_2308[3];
        fStack_156c = (float)((ulong)local_2308[3] >> 0x20);
        local_15c8 = (float)puVar8[0xe];
        fStack_15c4 = (float)((ulong)puVar8[0xe] >> 0x20);
        fStack_15c0 = (float)puVar8[0xf];
        fStack_15bc = (float)((ulong)puVar8[0xf] >> 0x20);
        local_15d8 = (float)local_2308[4];
        fStack_15d4 = (float)((ulong)local_2308[4] >> 0x20);
        fStack_15d0 = (float)local_2308[5];
        fStack_15cc = (float)((ulong)local_2308[5] >> 0x20);
        local_1628 = (float)puVar8[0x10];
        fStack_1624 = (float)((ulong)puVar8[0x10] >> 0x20);
        fStack_1620 = (float)puVar8[0x11];
        fStack_161c = (float)((ulong)puVar8[0x11] >> 0x20);
        local_1638 = (float)local_2308[6];
        fStack_1634 = (float)((ulong)local_2308[6] >> 0x20);
        fStack_1630 = (float)local_2308[7];
        fStack_162c = (float)((ulong)local_2308[7] >> 0x20);
        local_1688 = (float)puVar8[0x12];
        fStack_1684 = (float)((ulong)puVar8[0x12] >> 0x20);
        fStack_1680 = (float)puVar8[0x13];
        fStack_167c = (float)((ulong)puVar8[0x13] >> 0x20);
        local_1698 = (float)local_2308[8];
        fStack_1694 = (float)((ulong)local_2308[8] >> 0x20);
        fStack_1690 = (float)local_2308[9];
        fStack_168c = (float)((ulong)local_2308[9] >> 0x20);
        local_16e8 = (float)puVar8[0x14];
        fStack_16e4 = (float)((ulong)puVar8[0x14] >> 0x20);
        fStack_16e0 = (float)puVar8[0x15];
        fStack_16dc = (float)((ulong)puVar8[0x15] >> 0x20);
        local_16f8 = (float)*local_2310;
        fStack_16f4 = (float)((ulong)*local_2310 >> 0x20);
        fStack_16f0 = (float)local_2310[1];
        fStack_16ec = (float)((ulong)local_2310[1] >> 0x20);
        local_1748 = (float)puVar8[0x16];
        fStack_1744 = (float)((ulong)puVar8[0x16] >> 0x20);
        fStack_1740 = (float)puVar8[0x17];
        fStack_173c = (float)((ulong)puVar8[0x17] >> 0x20);
        local_1758 = (float)local_2310[2];
        fStack_1754 = (float)((ulong)local_2310[2] >> 0x20);
        fStack_1750 = (float)local_2310[3];
        fStack_174c = (float)((ulong)local_2310[3] >> 0x20);
        local_17a8 = (float)puVar8[0x18];
        fStack_17a4 = (float)((ulong)puVar8[0x18] >> 0x20);
        fStack_17a0 = (float)puVar8[0x19];
        fStack_179c = (float)((ulong)puVar8[0x19] >> 0x20);
        local_17b8 = (float)local_2310[4];
        fStack_17b4 = (float)((ulong)local_2310[4] >> 0x20);
        fStack_17b0 = (float)local_2310[5];
        fStack_17ac = (float)((ulong)local_2310[5] >> 0x20);
        local_1808 = (float)puVar8[0x1a];
        fStack_1804 = (float)((ulong)puVar8[0x1a] >> 0x20);
        fStack_1800 = (float)puVar8[0x1b];
        fStack_17fc = (float)((ulong)puVar8[0x1b] >> 0x20);
        local_1818 = (float)local_2310[6];
        fStack_1814 = (float)((ulong)local_2310[6] >> 0x20);
        fStack_1810 = (float)local_2310[7];
        fStack_180c = (float)((ulong)local_2310[7] >> 0x20);
        local_1868 = (float)puVar8[0x1c];
        fStack_1864 = (float)((ulong)puVar8[0x1c] >> 0x20);
        fStack_1860 = (float)puVar8[0x1d];
        fStack_185c = (float)((ulong)puVar8[0x1d] >> 0x20);
        local_1878 = (float)local_2310[8];
        fStack_1874 = (float)((ulong)local_2310[8] >> 0x20);
        fStack_1870 = (float)local_2310[9];
        fStack_186c = (float)((ulong)local_2310[9] >> 0x20);
        local_18c8 = (float)puVar8[0x1e];
        fStack_18c4 = (float)((ulong)puVar8[0x1e] >> 0x20);
        fStack_18c0 = (float)puVar8[0x1f];
        fStack_18bc = (float)((ulong)puVar8[0x1f] >> 0x20);
        local_18d8 = (float)*local_2318;
        fStack_18d4 = (float)((ulong)*local_2318 >> 0x20);
        fStack_18d0 = (float)local_2318[1];
        fStack_18cc = (float)((ulong)local_2318[1] >> 0x20);
        local_1928 = (float)puVar8[0x20];
        fStack_1924 = (float)((ulong)puVar8[0x20] >> 0x20);
        fStack_1920 = (float)puVar8[0x21];
        fStack_191c = (float)((ulong)puVar8[0x21] >> 0x20);
        local_1938 = (float)local_2318[2];
        fStack_1934 = (float)((ulong)local_2318[2] >> 0x20);
        fStack_1930 = (float)local_2318[3];
        fStack_192c = (float)((ulong)local_2318[3] >> 0x20);
        local_1988 = (float)puVar8[0x22];
        fStack_1984 = (float)((ulong)puVar8[0x22] >> 0x20);
        fStack_1980 = (float)puVar8[0x23];
        fStack_197c = (float)((ulong)puVar8[0x23] >> 0x20);
        local_1998 = (float)local_2318[4];
        fStack_1994 = (float)((ulong)local_2318[4] >> 0x20);
        fStack_1990 = (float)local_2318[5];
        fStack_198c = (float)((ulong)local_2318[5] >> 0x20);
        local_19e8 = (float)puVar8[0x24];
        fStack_19e4 = (float)((ulong)puVar8[0x24] >> 0x20);
        fStack_19e0 = (float)puVar8[0x25];
        fStack_19dc = (float)((ulong)puVar8[0x25] >> 0x20);
        local_19f8 = (float)local_2318[6];
        fStack_19f4 = (float)((ulong)local_2318[6] >> 0x20);
        fStack_19f0 = (float)local_2318[7];
        fStack_19ec = (float)((ulong)local_2318[7] >> 0x20);
        local_1a48 = (float)puVar8[0x26];
        fStack_1a44 = (float)((ulong)puVar8[0x26] >> 0x20);
        fStack_1a40 = (float)puVar8[0x27];
        fStack_1a3c = (float)((ulong)puVar8[0x27] >> 0x20);
        local_1a58 = (float)local_2318[8];
        fStack_1a54 = (float)((ulong)local_2318[8] >> 0x20);
        fStack_1a50 = (float)local_2318[9];
        fStack_1a4c = (float)((ulong)local_2318[9] >> 0x20);
        local_1aa8 = (float)puVar8[0x28];
        fStack_1aa4 = (float)((ulong)puVar8[0x28] >> 0x20);
        fStack_1aa0 = (float)puVar8[0x29];
        fStack_1a9c = (float)((ulong)puVar8[0x29] >> 0x20);
        local_1ab8 = (float)*local_2320;
        fStack_1ab4 = (float)((ulong)*local_2320 >> 0x20);
        fStack_1ab0 = (float)local_2320[1];
        fStack_1aac = (float)((ulong)local_2320[1] >> 0x20);
        local_1b08 = (float)puVar8[0x2a];
        fStack_1b04 = (float)((ulong)puVar8[0x2a] >> 0x20);
        fStack_1b00 = (float)puVar8[0x2b];
        fStack_1afc = (float)((ulong)puVar8[0x2b] >> 0x20);
        local_1b18 = (float)local_2320[2];
        fStack_1b14 = (float)((ulong)local_2320[2] >> 0x20);
        fStack_1b10 = (float)local_2320[3];
        fStack_1b0c = (float)((ulong)local_2320[3] >> 0x20);
        local_1b68 = (float)puVar8[0x2c];
        fStack_1b64 = (float)((ulong)puVar8[0x2c] >> 0x20);
        fStack_1b60 = (float)puVar8[0x2d];
        fStack_1b5c = (float)((ulong)puVar8[0x2d] >> 0x20);
        local_1b78 = (float)local_2320[4];
        fStack_1b74 = (float)((ulong)local_2320[4] >> 0x20);
        fStack_1b70 = (float)local_2320[5];
        fStack_1b6c = (float)((ulong)local_2320[5] >> 0x20);
        local_1bc8 = (float)puVar8[0x2e];
        fStack_1bc4 = (float)((ulong)puVar8[0x2e] >> 0x20);
        fStack_1bc0 = (float)puVar8[0x2f];
        fStack_1bbc = (float)((ulong)puVar8[0x2f] >> 0x20);
        local_1bd8 = (float)local_2320[6];
        fStack_1bd4 = (float)((ulong)local_2320[6] >> 0x20);
        fStack_1bd0 = (float)local_2320[7];
        fStack_1bcc = (float)((ulong)local_2320[7] >> 0x20);
        local_1c28 = (float)puVar8[0x30];
        fStack_1c24 = (float)((ulong)puVar8[0x30] >> 0x20);
        fStack_1c20 = (float)puVar8[0x31];
        fStack_1c1c = (float)((ulong)puVar8[0x31] >> 0x20);
        local_1c38 = (float)local_2320[8];
        fStack_1c34 = (float)((ulong)local_2320[8] >> 0x20);
        fStack_1c30 = (float)local_2320[9];
        fStack_1c2c = (float)((ulong)local_2320[9] >> 0x20);
        *local_22a8 = CONCAT44(fStack_1c24 * fStack_1c34 +
                               fStack_1bc4 * fStack_1bd4 +
                               fStack_1b64 * fStack_1b74 +
                               fStack_1b04 * fStack_1b14 +
                               fStack_1aa4 * fStack_1ab4 +
                               fStack_1a44 * fStack_1a54 +
                               fStack_19e4 * fStack_19f4 +
                               fStack_1984 * fStack_1994 +
                               fStack_1924 * fStack_1934 +
                               fStack_18c4 * fStack_18d4 +
                               fStack_1864 * fStack_1874 +
                               fStack_1804 * fStack_1814 +
                               fStack_17a4 * fStack_17b4 +
                               fStack_1744 * fStack_1754 +
                               fStack_16e4 * fStack_16f4 +
                               fStack_1684 * fStack_1694 +
                               fStack_1624 * fStack_1634 +
                               fStack_15c4 * fStack_15d4 +
                               fStack_1564 * fStack_1574 +
                               fStack_1504 * fStack_1514 +
                               fStack_14a4 * fStack_14b4 +
                               fStack_1444 * fStack_1454 +
                               fStack_13e4 * fStack_13f4 +
                               fStack_1384 * fStack_1394 + fStack_1324 * fStack_1334 + fStack_94,
                               local_1c28 * local_1c38 +
                               local_1bc8 * local_1bd8 +
                               local_1b68 * local_1b78 +
                               local_1b08 * local_1b18 +
                               local_1aa8 * local_1ab8 +
                               local_1a48 * local_1a58 +
                               local_19e8 * local_19f8 +
                               local_1988 * local_1998 +
                               local_1928 * local_1938 +
                               local_18c8 * local_18d8 +
                               local_1868 * local_1878 +
                               local_1808 * local_1818 +
                               local_17a8 * local_17b8 +
                               local_1748 * local_1758 +
                               local_16e8 * local_16f8 +
                               local_1688 * local_1698 +
                               local_1628 * local_1638 +
                               local_15c8 * local_15d8 +
                               local_1568 * local_1578 +
                               local_1508 * local_1518 +
                               local_14a8 * local_14b8 +
                               local_1448 * local_1458 +
                               local_13e8 * local_13f8 +
                               local_1388 * local_1398 + local_1328 * local_1338 + local_98);
        local_22a8[1] =
             CONCAT44(fStack_1c1c * fStack_1c2c +
                      fStack_1bbc * fStack_1bcc +
                      fStack_1b5c * fStack_1b6c +
                      fStack_1afc * fStack_1b0c +
                      fStack_1a9c * fStack_1aac +
                      fStack_1a3c * fStack_1a4c +
                      fStack_19dc * fStack_19ec +
                      fStack_197c * fStack_198c +
                      fStack_191c * fStack_192c +
                      fStack_18bc * fStack_18cc +
                      fStack_185c * fStack_186c +
                      fStack_17fc * fStack_180c +
                      fStack_179c * fStack_17ac +
                      fStack_173c * fStack_174c +
                      fStack_16dc * fStack_16ec +
                      fStack_167c * fStack_168c +
                      fStack_161c * fStack_162c +
                      fStack_15bc * fStack_15cc +
                      fStack_155c * fStack_156c +
                      fStack_14fc * fStack_150c +
                      fStack_149c * fStack_14ac +
                      fStack_143c * fStack_144c +
                      fStack_13dc * fStack_13ec +
                      fStack_137c * fStack_138c + fStack_131c * fStack_132c + fStack_8c,
                      fStack_1c20 * fStack_1c30 +
                      fStack_1bc0 * fStack_1bd0 +
                      fStack_1b60 * fStack_1b70 +
                      fStack_1b00 * fStack_1b10 +
                      fStack_1aa0 * fStack_1ab0 +
                      fStack_1a40 * fStack_1a50 +
                      fStack_19e0 * fStack_19f0 +
                      fStack_1980 * fStack_1990 +
                      fStack_1920 * fStack_1930 +
                      fStack_18c0 * fStack_18d0 +
                      fStack_1860 * fStack_1870 +
                      fStack_1800 * fStack_1810 +
                      fStack_17a0 * fStack_17b0 +
                      fStack_1740 * fStack_1750 +
                      fStack_16e0 * fStack_16f0 +
                      fStack_1680 * fStack_1690 +
                      fStack_1620 * fStack_1630 +
                      fStack_15c0 * fStack_15d0 +
                      fStack_1560 * fStack_1570 +
                      fStack_1500 * fStack_1510 +
                      fStack_14a0 * fStack_14b0 +
                      fStack_1440 * fStack_1450 +
                      fStack_13e0 * fStack_13f0 +
                      fStack_1380 * fStack_1390 + fStack_1320 * fStack_1330 + fStack_90);
        local_22a8 = local_22a8 + 2;
        local_2300 = local_2300 + 2;
        local_2308 = local_2308 + 2;
        local_2310 = local_2310 + 2;
        local_2318 = local_2318 + 2;
        local_2320 = local_2320 + 2;
      }
      local_2300 = local_2300 + 8;
      local_2308 = local_2308 + 8;
      local_2310 = local_2310 + 8;
      local_2318 = local_2318 + 8;
      local_2320 = local_2320 + 8;
    }
  }
  return;
}

Assistant:

static void convdw5x5s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps(bias + g * 4) : _mm_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);
        const float* r5 = img0.row(5);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;
                __m128 _sum1 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k03, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k04, _r14, _sum1);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k13, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k14, _r24, _sum1);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r32, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k23, _r33, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k24, _r34, _sum1);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k30, _r40, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k31, _r41, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k32, _r42, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k33, _r43, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k34, _r44, _sum1);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                __m128 _r50 = _mm_load_ps(r5);
                __m128 _r51 = _mm_load_ps(r5 + 4);
                __m128 _r52 = _mm_load_ps(r5 + 4 * 2);
                __m128 _r53 = _mm_load_ps(r5 + 4 * 3);
                __m128 _r54 = _mm_load_ps(r5 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k40, _r50, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k41, _r51, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k42, _r52, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k43, _r53, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k44, _r54, _sum1);

                _mm_store_ps(outptr0, _sum0);
                _mm_store_ps(outptr1, _sum1);

                outptr0 += 4;
                outptr1 += 4;

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;
                r5 += 4;
            }

            r0 += 4 * 4 + w * 4;
            r1 += 4 * 4 + w * 4;
            r2 += 4 * 4 + w * 4;
            r3 += 4 * 4 + w * 4;
            r4 += 4 * 4 + w * 4;
            r5 += 4 * 4 + w * 4;

            outptr0 += outw * 4;
            outptr1 += outw * 4;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm_store_ps(outptr0, _sum0);

                outptr0 += 4;

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;
            }

            r0 += 4 * 4;
            r1 += 4 * 4;
            r2 += 4 * 4;
            r3 += 4 * 4;
            r4 += 4 * 4;
        }
    }
}